

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

bool kratos::safe_to_resize_
               (Simulator *sim,Var *var,uint32_t target_size,bool is_signed,
               queue<const_kratos::IterVar_*,_std::deque<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>_>
               *vars)

{
  bool *pbVar1;
  IterVar *pIVar2;
  Var *pVVar3;
  bool bVar4;
  int iVar5;
  VarType VVar6;
  uint uVar7;
  ConstantLegal CVar8;
  undefined4 extraout_var;
  reference ppIVar9;
  int64_t iVar10;
  long *plVar11;
  optional<long> value;
  optional<long> oVar12;
  bool r;
  _Storage<long,_true> _Stack_e8;
  bool result_1;
  optional<long> num_1;
  optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> v_1;
  undefined1 local_b0 [12];
  undefined1 local_99;
  int local_98;
  bool result;
  _Storage<long,_true> local_88;
  optional<long> num;
  optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> v;
  undefined1 local_50 [12];
  IterVar *local_40;
  IterVar *t;
  Var *p;
  queue<const_kratos::IterVar_*,_std::deque<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>_>
  *vars_local;
  bool is_signed_local;
  Var *pVStack_20;
  uint32_t target_size_local;
  Var *var_local;
  Simulator *sim_local;
  
  p = (Var *)vars;
  vars_local._3_1_ = is_signed;
  vars_local._4_4_ = target_size;
  pVStack_20 = var;
  var_local = (Var *)sim;
  bVar4 = std::
          queue<const_kratos::IterVar_*,_std::deque<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>_>
          ::empty(vars);
  if (bVar4) {
    iVar5 = (*(pVStack_20->super_IRNode)._vptr_IRNode[0x28])();
    t = (IterVar *)CONCAT44(extraout_var,iVar5);
    VVar6 = Var::type((Var *)t);
    if ((VVar6 == Base) || (VVar6 = Var::type(&t->super_Var), VVar6 == PortIO)) {
      uVar7 = (*(pVStack_20->super_IRNode)._vptr_IRNode[7])();
      sim_local._7_1_ = uVar7 <= vars_local._4_4_;
    }
    else {
      sim_local._7_1_ = 1;
    }
  }
  else {
    ppIVar9 = std::
              queue<const_kratos::IterVar_*,_std::deque<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>_>
              ::front((queue<const_kratos::IterVar_*,_std::deque<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>_>
                       *)p);
    local_40 = *ppIVar9;
    std::
    queue<const_kratos::IterVar_*,_std::deque<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>_>
    ::pop((queue<const_kratos::IterVar_*,_std::deque<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>_>
           *)p);
    pVVar3 = var_local;
    pIVar2 = local_40;
    v.super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
    .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
    _24_8_ = IterVar::min_value(local_40);
    std::optional<long>::optional<long,_true>
              ((optional<long> *)local_50,
               (long *)&v.
                        super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        ._M_engaged);
    oVar12.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _12_4_ = 0;
    oVar12.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_payload = (_Storage<long,_true>)local_50._0_8_;
    oVar12.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_engaged = (bool)local_50[8];
    oVar12.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _9_3_ = local_50._9_3_;
    Simulator::set_i((Simulator *)pVVar3,&pIVar2->super_Var,oVar12,false);
    pbVar1 = &num.super__Optional_base<long,_true,_true>._M_payload.
              super__Optional_payload_base<long>._M_engaged;
    Simulator::eval_expr
              ((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)pbVar1,
               (Simulator *)var_local,pVStack_20);
    oVar12 = convert_value(pVStack_20,
                           (optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
                           pbVar1);
    local_88._M_value =
         oVar12.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
         ._M_payload;
    num.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_payload._M_value._0_1_ =
         oVar12.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
         ._M_engaged;
    bVar4 = std::optional::operator_cast_to_bool((optional *)&local_88);
    if (bVar4) {
      plVar11 = std::optional<long>::operator*((optional<long> *)&local_88);
      CVar8 = Const::is_legal(*plVar11,vars_local._4_4_,(bool)(vars_local._3_1_ & 1));
      local_99 = CVar8 == Legal;
      if ((bool)local_99) {
        local_98 = 0;
      }
      else {
        sim_local._7_1_ = 0;
        local_98 = 1;
      }
    }
    else {
      sim_local._7_1_ = 0;
      local_98 = 1;
    }
    std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::~optional
              ((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
               &num.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged);
    pVVar3 = var_local;
    pIVar2 = local_40;
    if (local_98 == 0) {
      iVar10 = IterVar::max_value(local_40);
      v_1.
      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
      _24_8_ = iVar10 + -1;
      std::optional<long>::optional<long,_true>
                ((optional<long> *)local_b0,
                 (long *)&v_1.
                          super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          ._M_engaged);
      value.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
      _12_4_ = 0;
      value.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
      _M_payload = (_Storage<long,_true>)local_b0._0_8_;
      value.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
      _M_engaged = (bool)local_b0[8];
      value.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
      _9_3_ = local_b0._9_3_;
      Simulator::set_i((Simulator *)pVVar3,&pIVar2->super_Var,value,false);
      pbVar1 = &num_1.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged;
      Simulator::eval_expr
                ((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)pbVar1,
                 (Simulator *)var_local,pVStack_20);
      oVar12 = convert_value(pVStack_20,
                             (optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              *)pbVar1);
      _Stack_e8._M_value =
           oVar12.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._M_payload;
      num_1.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
      _M_payload._M_value._0_1_ =
           oVar12.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._M_engaged;
      bVar4 = std::optional::operator_cast_to_bool((optional *)&stack0xffffffffffffff18);
      if (bVar4) {
        plVar11 = std::optional<long>::operator*((optional<long> *)&stack0xffffffffffffff18);
        CVar8 = Const::is_legal(*plVar11,vars_local._4_4_,(bool)(vars_local._3_1_ & 1));
        if (CVar8 == Legal) {
          local_98 = 0;
        }
        else {
          sim_local._7_1_ = 0;
          local_98 = 1;
        }
      }
      else {
        sim_local._7_1_ = 0;
        local_98 = 1;
      }
      std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::~optional
                ((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
                 &num_1.super__Optional_base<long,_true,_true>._M_payload.
                  super__Optional_payload_base<long>._M_engaged);
      if (local_98 == 0) {
        bVar4 = safe_to_resize_((Simulator *)var_local,pVStack_20,vars_local._4_4_,
                                (bool)(vars_local._3_1_ & 1),
                                (queue<const_kratos::IterVar_*,_std::deque<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>_>
                                 *)p);
        std::
        queue<const_kratos::IterVar_*,_std::deque<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>_>
        ::push((queue<const_kratos::IterVar_*,_std::deque<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>_>
                *)p,&local_40);
        sim_local._7_1_ = bVar4;
      }
    }
  }
  return (bool)(sim_local._7_1_ & 1);
}

Assistant:

bool safe_to_resize_(Simulator &sim, const Var *var, uint32_t target_size, bool is_signed,
                     std::queue<const IterVar *> &vars) {
    // notice it's exclusive for max
    if (vars.empty()) {
        const auto *p = var->get_var_root_parent();
        if (p->type() == VarType::Base || p->type() == VarType::PortIO)
            return var->width() <= target_size;
        else
            return true;
    } else {
        // pop one
        auto *t = const_cast<IterVar *>(vars.front());
        vars.pop();
        sim.set_i(t, t->min_value(), false);
        {
            auto v = sim.eval_expr(var);
            auto num = convert_value(var, v);
            if (!num) return false;
            auto result =
                Const::is_legal(*num, target_size, is_signed) == Const::ConstantLegal::Legal;
            if (!result) return false;
        }
        // notice it's exclusive for max
        sim.set_i(t, t->max_value() - 1, false);
        {
            auto v = sim.eval_expr(var);
            auto num = convert_value(var, v);
            if (!num) return false;
            auto result =
                Const::is_legal(*num, target_size, is_signed) == Const::ConstantLegal::Legal;
            if (!result) return false;
        }
        auto r = safe_to_resize_(sim, var, target_size, is_signed, vars);
        // put it back for backtracking
        vars.push(t);
        return r;
    }
}